

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.cc
# Opt level: O0

void kratos::hash_generator_src(Context *context,Generator *generator)

{
  void *input;
  uint64_t uVar1;
  istreambuf_iterator<char,_std::char_traits<char>_> __first;
  istreambuf_iterator<char,_std::char_traits<char>_> __last;
  uint64_t hash;
  undefined4 local_288;
  undefined1 local_280 [12];
  string local_270 [8];
  string content;
  undefined1 local_240 [8];
  ifstream fs;
  undefined1 local_38 [8];
  string filename;
  Generator *generator_local;
  Context *context_local;
  
  filename.field_2._8_8_ = generator;
  Generator::external_filename_abi_cxx11_((string *)local_38,generator);
  std::ifstream::ifstream(local_240,(string *)local_38,_S_in);
  std::__cxx11::string::string(local_270);
  std::istreambuf_iterator<char,_std::char_traits<char>_>::istreambuf_iterator
            ((istreambuf_iterator<char,_std::char_traits<char>_> *)local_280,
             (istream_type *)local_240);
  std::istreambuf_iterator<char,_std::char_traits<char>_>::istreambuf_iterator
            ((istreambuf_iterator<char,_std::char_traits<char>_> *)&hash);
  __first._12_4_ = 0;
  __first._M_sbuf = (streambuf_type *)local_280._0_8_;
  __first._M_c = local_280._8_4_;
  __last._12_4_ = 0;
  __last._M_sbuf = (streambuf_type *)hash;
  __last._M_c = local_288;
  std::__cxx11::string::assign<std::istreambuf_iterator<char,std::char_traits<char>>,void>
            (local_270,__first,__last);
  input = (void *)std::__cxx11::string::c_str();
  uVar1 = std::__cxx11::string::size();
  uVar1 = XXHash64::hash(input,uVar1,0);
  Context::add_hash(context,(Generator *)filename.field_2._8_8_,uVar1);
  std::__cxx11::string::~string(local_270);
  std::ifstream::~ifstream(local_240);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void hash_generator_src(Context* context, Generator* generator) {
    auto filename = generator->external_filename();
    std::ifstream fs(filename);

    std::string content;
    content.assign(std::istreambuf_iterator<char>(fs), std::istreambuf_iterator<char>());
    uint64_t hash = XXHash64::hash(content.c_str(), content.size(), 0);
    context->add_hash(generator, hash);
}